

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_annotate.cpp
# Opt level: O1

void snestistics::guess_range
               (Trace *trace,RomAccessor *rom,AnnotationResolver *annotations,string *output_file)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color p;
  _Rb_tree_color p_00;
  pointer pAVar2;
  pointer pcVar3;
  pointer pFVar4;
  byte opcode;
  bool bVar5;
  Pointer PVar6;
  uint uVar7;
  Hint *pHVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  size_type_conflict __n;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  pointer pFVar18;
  pointer pAVar19;
  char cVar20;
  int iVar21;
  _Rb_tree_header *p_Var22;
  Pointer jump_target;
  Pointer jump_secondary_target;
  FoundRange found;
  vector<unsigned_int,_std::allocator<unsigned_int>_> merged_with;
  vector<FoundRange,_std::allocator<FoundRange>_> found_ranges;
  uint local_12c;
  uint local_118;
  _Rb_tree_color local_10c;
  AnnotationResolver *local_108;
  ulong local_100;
  ulong local_f8;
  pointer local_f0;
  Pointer local_e4;
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8 [24];
  _Rb_tree_node_base *local_90;
  _Rb_tree_node_base local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<FoundRange,_std::allocator<FoundRange>_> local_48;
  
  local_108 = annotations;
  local_80._M_right = (_Base_ptr)fopen((output_file->_M_dataplus)._M_p,"wt");
  local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var9 = (trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var22 = &(trace->ops)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var22) {
    do {
      local_e0._0_8_ = (Annotation *)0xffffffffffffffff;
      local_e0[8] = 1;
      local_e0._8_8_ = local_e0._8_8_ & 0xffffffff;
      local_d0._8_4_ = _S_red;
      local_d0._16_8_ = (_Base_ptr)0x0;
      local_b8 = (_Base_ptr)(local_d0 + 8);
      local_a8._0_8_ = 0;
      local_b0 = local_b8;
      do {
        if ((_Rb_tree_header *)p_Var9 == p_Var22) break;
        _Var1 = p_Var9[1]._M_color;
        local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        AnnotationResolver::resolve_annotation
                  (local_108,_Var1,(Annotation **)&local_60,(Annotation **)0x0);
        iVar21 = 6;
        if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          opcode = RomAccessor::evalByte(rom,_Var1);
          if (local_e0._0_4_ == 0xffffffff) {
            local_e0._0_4_ = _Var1;
          }
          if ((&jump_or_branch)[opcode] == '\x01') {
            pHVar8 = AnnotationResolver::hint(local_108,_Var1);
            if ((pHVar8 == (Hint *)0x0) || (cVar20 = '\x01', (pHVar8->hints & 0x20) == 0)) {
              cVar20 = (&branches8)[opcode];
            }
            bVar5 = decode_static_jump(opcode,rom,_Var1,&local_10c,&local_e4);
            if ((cVar20 != '\0') &&
               (((local_10c ^ _Var1) < 0x10000 && local_10c != ~_S_red) && bVar5)) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)local_d0,&local_10c);
            }
            if (bVar5 && local_e4 == 0xffffffff) {
              local_e0._4_4_ = _Var1;
              iVar21 = 6;
              std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back
                        (&local_48,(value_type *)local_e0);
            }
            else {
LAB_001400f5:
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              iVar21 = 0;
            }
          }
          else {
            if ((0x2b < opcode - 0x40) ||
               ((0x80100000001U >> ((ulong)(opcode - 0x40) & 0x3f) & 1) == 0)) goto LAB_001400f5;
            local_e0._4_4_ = _Var1;
            std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back
                      (&local_48,(value_type *)local_e0);
          }
        }
      } while (iVar21 == 0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_d0);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var22);
  }
  pFVar4 = local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_f0 = local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
             super__Vector_impl_data._M_finish;
  __n = (long)local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
              super__Vector_impl_data._M_start >> 6;
  local_e0._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_60,__n,(value_type_conflict1 *)local_e0,(allocator_type *)&local_10c);
  uVar15 = 0;
  local_100 = CONCAT44(local_100._4_4_,2);
  local_12c = 0xffffffff;
  local_f8 = __n;
  do {
    uVar12 = uVar15;
    if (local_f8 == uVar15) break;
    do {
      uVar13 = uVar12;
      uVar12 = (ulong)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13];
    } while (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13] != 0xffffffff);
    p_Var22 = &pFVar4[uVar15].branches_out._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = pFVar4[uVar15].branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar17 = (uint)uVar15;
    if ((_Rb_tree_header *)p_Var10 != p_Var22) {
      pFVar18 = pFVar4 + uVar15;
      do {
        _Var1 = p_Var10[1]._M_color;
        if ((_Var1 < pFVar18->start) || (pFVar18->stop < _Var1)) {
          local_e0._0_8_ = (Annotation *)0x0;
          AnnotationResolver::resolve_annotation
                    (local_108,_Var1,(Annotation **)local_e0,(Annotation **)0x0);
          if ((Annotation *)local_e0._0_8_ == (Annotation *)0x0) {
            p = pFVar18->start;
            p_00 = pFVar18->stop;
            iVar21 = p - _Var1;
            if (p < _Var1 || p - _Var1 == 0) {
              iVar21 = _Var1 - p_00;
            }
            if (1000 < iVar21) {
              pFVar18->num_long_jumps = pFVar18->num_long_jumps + 1;
            }
            if (_Var1 < p) {
              PVar6 = AnnotationResolver::find_last_free_before_or_at(local_108,p,_Var1);
              uVar12 = uVar15;
              uVar11 = local_12c;
              if (PVar6 != 0xffffffff) {
                do {
                  if ((int)uVar11 < 0) break;
                  uVar16 = (ulong)uVar11;
                  if (PVar6 <= pFVar4[uVar16].stop) {
                    uVar12 = (ulong)uVar11;
                  }
                  uVar11 = uVar11 - 1;
                } while (PVar6 <= pFVar4[uVar16].stop);
                if ((uint)uVar12 != uVar17) {
                  do {
                    uVar7 = (uint)uVar12;
                    uVar12 = (ulong)local_60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(int)uVar7];
                    uVar11 = uVar7;
                  } while (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[(int)uVar7] != 0xffffffff);
                  while (uVar11 = uVar11 + 1, uVar11 <= uVar17) {
                    if (pFVar4[uVar11].valid == true) {
                      pFVar4[uVar11].valid = false;
                      local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar11] = uVar7;
                    }
                  }
                  pFVar4[(int)uVar7].stop = pFVar18->stop;
                }
              }
            }
            else if (((p_00 < _Var1) &&
                     (PVar6 = AnnotationResolver::find_last_free_after_or_at(local_108,p_00,_Var1),
                     PVar6 != 0xffffffff)) && (uVar17 + 1 < local_f8)) {
              uVar12 = (ulong)(uVar17 + 1);
              uVar11 = (uint)local_100;
              do {
                if (PVar6 < pFVar4[uVar12].start) break;
                if (pFVar4[uVar12].valid == true) {
                  if (pFVar4[uVar13].stop < pFVar4[uVar12].stop) {
                    pFVar4[uVar13].stop = pFVar4[uVar12].stop;
                  }
                  pFVar4[uVar12].valid = false;
                  local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] = (uint)uVar13;
                }
                uVar12 = (ulong)uVar11;
                uVar11 = uVar11 + 1;
              } while (uVar12 < local_f8);
            }
          }
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var22);
    }
    if (local_f8 == uVar15) break;
    uVar15 = (ulong)(uVar17 + 1);
    local_100 = CONCAT44(local_100._4_4_,(uint)local_100 + 1);
    local_12c = local_12c + 1;
  } while (uVar15 <= local_f8);
  if (local_f0 == pFVar4) {
    local_118 = 0xffffffff;
    uVar17 = 0;
    uVar11 = 0xffffffff;
    local_12c = 0;
  }
  else {
    uVar11 = 0xffffffff;
    local_100 = 0;
    uVar12 = 0;
    local_12c = 0;
    local_118 = 0xffffffff;
    uVar17 = 0;
    uVar15 = local_f8;
    do {
      pFVar18 = pFVar4 + uVar12;
      if (4 < pFVar4[uVar12].num_long_jumps) {
        printf("Long jumps to %06X-%06X (%d)\n",(ulong)pFVar18->start,(ulong)pFVar18->stop);
      }
      if (pFVar18->valid == true) {
        pAVar19 = (local_108->_annotations).
                  super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar2 = (local_108->_annotations).
                 super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pAVar19 != pAVar2) {
          local_f0 = (pointer)CONCAT44(local_f0._4_4_,uVar11);
          bVar14 = false;
          bVar5 = false;
          do {
            local_e0._0_4_ = pAVar19->type;
            local_e0._8_8_ = local_d0 + 8;
            pcVar3 = (pAVar19->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_e0 + 8),pcVar3,pcVar3 + (pAVar19->name)._M_string_length);
            local_b8 = (_Base_ptr)local_a8;
            pcVar3 = (pAVar19->comment)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,pcVar3,pcVar3 + (pAVar19->comment)._M_string_length);
            local_a8[0x10] = pAVar19->comment_is_multiline;
            local_90 = &local_80;
            pcVar3 = (pAVar19->useComment)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + (pAVar19->useComment)._M_string_length);
            p_Var9 = *(_Base_ptr *)&pAVar19->startOfRange;
            cVar20 = '\0';
            if (local_e0._0_4_ == 1) {
              uVar11 = pFVar18->stop;
              local_80._M_left._0_4_ = (uint)p_Var9;
              local_80._M_left._4_4_ = (uint)((ulong)p_Var9 >> 0x20);
              cVar20 = (local_80._M_left._4_4_ < uVar11 || uVar11 < (uint)local_80._M_left) + '$';
              bVar5 = bVar14;
              if (local_80._M_left._4_4_ >= uVar11 && uVar11 >= (uint)local_80._M_left) {
                bVar14 = true;
                bVar5 = true;
              }
            }
            local_80._M_left = p_Var9;
            if (local_90 != &local_80) {
              operator_delete(local_90);
            }
            if (local_b8 != (_Base_ptr)local_a8) {
              operator_delete(local_b8);
            }
            if ((undefined1 *)local_e0._8_8_ != local_d0 + 8) {
              operator_delete((void *)local_e0._8_8_);
            }
          } while (((cVar20 == '%') || (cVar20 == '\0')) &&
                  (pAVar19 = pAVar19 + 1, pAVar19 != pAVar2));
          uVar11 = (uint)local_f0;
          if (bVar5) {
            puts("Collision!");
            uVar15 = local_f8;
            goto LAB_001405bd;
          }
        }
        uVar7 = pFVar18->stop - pFVar18->start;
        if (local_12c < uVar7) {
          uVar11 = (uint)uVar12;
          local_118 = uVar17;
        }
        if (local_12c < uVar7) {
          local_12c = uVar7 + 1;
        }
        uVar17 = uVar17 + 1;
        iVar21 = (int)local_100;
        fprintf((FILE *)local_80._M_right,"function %06X %06X Auto%04d\n");
        local_100 = (ulong)(iVar21 + 1);
        uVar15 = local_f8;
      }
LAB_001405bd:
      uVar12 = (ulong)((uint)uVar12 + 1);
    } while (uVar12 < uVar15);
  }
  printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n",(ulong)uVar17,(ulong)local_118,
         (ulong)local_12c,(ulong)uVar11);
  fclose((FILE *)local_80._M_right);
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  std::vector<FoundRange,_std::allocator<FoundRange>_>::~vector(&local_48);
  return;
}

Assistant:

void guess_range(const Trace &trace, const RomAccessor &rom, const AnnotationResolver &annotations, std::string &output_file) {

	FILE *output = fopen(output_file.c_str(), "wt");

	int unknownCounter = 0;

	struct FoundRange {
		Pointer start = INVALID_POINTER, stop = INVALID_POINTER;
		bool valid = true;

		bool inside(Pointer p) const { return p >= start && p <= stop; }

		int num_long_jumps = 0;

		std::set<Pointer> branches_out;
	};

	// TODO: Support trace annotation jump is jsr
	std::vector<FoundRange> found_ranges;

	for (auto it = trace.ops.begin(); it != trace.ops.end(); ++it) {
		FoundRange found;
		while (it != trace.ops.end()) {
			Pointer pc = it->first;

			const Annotation *function = nullptr;
			annotations.resolve_annotation(pc, &function);

			// We only want unknown but executed stuff!
			if (function)
				break;

			uint8_t opcode = rom.evalByte(pc);

			if (found.start == INVALID_POINTER)
				found.start = pc;

			if (jump_or_branch[opcode]) {
				const Hint *hint = annotations.hint(pc);
				bool merge_long_jumps = hint && hint->has_hint(Hint::ANNOTATE_MERGE);
				bool relevant_jump = merge_long_jumps || branches8[opcode];

				Pointer jump_target, jump_secondary_target;
				bool op_is_jump_or_branch = decode_static_jump(opcode, rom, pc, &jump_target, &jump_secondary_target);

				bool jump_is_jsr = false;
				if (hint && hint->has_hint(Hint::JUMP_IS_JSR))
					jump_is_jsr = true;

				if (relevant_jump && op_is_jump_or_branch && jump_target != INVALID_POINTER && same_bank(pc, jump_target)) {
					found.branches_out.insert(jump_target);
				}

				// Stop if we find a branch or a jump
				if (op_is_jump_or_branch && jump_secondary_target == INVALID_POINTER) {
					// If there is a secondary jump target (as in a branch) we don't need to stop
					found.stop = pc;
					found_ranges.push_back(found);
					break;
				}
			} else if (opcode == 0x40 || opcode == 0x6B || opcode == 0x60) {
				// Some sort of return (RTS, RTI, RTL)
				found.stop = pc;
				found_ranges.push_back(found);
				break;
			}
			it++;
		}
	}

	std::vector<uint32_t> merged_with(found_ranges.size(), -1);

	for (uint32_t j = 0; j <= found_ranges.size(); ++j) { // TODO: Make <= be just <

		bool debug = false;

		if (debug) {
			printf("Step %d\n", j);

			for (uint32_t ai = 0; ai < found_ranges.size(); ai++) {
				const FoundRange &f = found_ranges[ai];
				printf(" %d: %06X-%06X%s", ai, f.start, f.stop, f.valid ? "" : " (invalid)");
				if (merged_with[ai] != -1)
					printf(" (merged with %d)", merged_with[ai]);
				printf("\n");

				if (ai >= j)
					for (auto b : f.branches_out) {
						if (f.inside(b))
							continue;
						printf("   -> %06X", b);
						for (uint32_t bi = 0; bi < found_ranges.size(); ++bi) {
							const FoundRange &fb = found_ranges[bi];
							if (fb.start <= b && b <= fb.stop)
								printf(" %d", bi);
						}
						printf("\n");
					}
			}
		}

		// We went one extra round for debugging!
		if (j == found_ranges.size())
			break;

		uint32_t merge_target = j;
		while (merged_with[merge_target] != -1)
			merge_target = merged_with[merge_target];

		auto &branches_out = found_ranges[j].branches_out;

		FoundRange &fj = found_ranges[j];

		//printf("Doing %d, saving into %d\n", j, merge_target);
		for (Pointer target : branches_out) {
			// We have three cases; forward, backward or internal branches. We treat them separately for clarity
			if (fj.inside(target)) // Ignore internal branches/jumps
				continue;

			// TODO: This is not enough.. We must stop at any function in the range...
			//       Basically cut target at any function def...
			const Annotation *target_function = nullptr;
			annotations.resolve_annotation(target, &target_function);
			if (target_function)
				continue;

			int len = 0;
			if (target < fj.start) {
				len = fj.start - target;
			}
			else {
				len = target - fj.stop;
			}
			if (len > 1000) {
				fj.num_long_jumps++;
			}

			Pointer t1 = target;

			if (target < fj.start) {
				target = annotations.find_last_free_before_or_at(fj.start, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;
				// Branch going out to smaller addresses (before j)

				int lowest_merge = j;

				for (int32_t t = j - 1; t >= 0; --t) {
					FoundRange &merger = found_ranges[t];
					if (target > merger.stop) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					lowest_merge = t;
				}

				if (lowest_merge == j)
					continue;

				while (merged_with[lowest_merge] != -1)
					lowest_merge = merged_with[lowest_merge];

				// We want to merge the range (lowest_range, ..., j) into lowest_range
				for (uint32_t t = lowest_merge + 1; t <= j; t++) {
					FoundRange &f = found_ranges[t];
					if (f.valid) {
						f.valid = false;
						merged_with[t] = lowest_merge;
					}
				}

				found_ranges[lowest_merge].stop = fj.stop;

			} else if (target > fj.stop) {

				target = annotations.find_last_free_after_or_at(fj.stop, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;

				// Branch going out to larger addresses (after j)
				for (uint32_t t = j + 1; t<found_ranges.size(); ++t) {
					FoundRange &merger = found_ranges[t];
					if (target < merger.start) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					if (merger.valid) {
						// Merge t into j (the easy case)
						if (merger.stop > found_ranges[merge_target].stop)
							found_ranges[merge_target].stop = merger.stop;
						merger.valid = false; // Since we make it invalid it can only be merged once...
						merged_with[t] = merge_target;
					}
				}
			}
		}
	}

	int num_found = 0;

	int longest = -1, longest_range = -1;
	uint32_t longest_length = 0;

	for (uint32_t fi = 0; fi < found_ranges.size(); ++fi) {
		const FoundRange &f = found_ranges[fi];
		if (f.num_long_jumps > 4) {
			printf("Long jumps to %06X-%06X (%d)\n", f.start, f.stop, f.num_long_jumps);
		}

		if (f.valid) {
			bool collision = false;
			for (auto k : annotations._annotations) {
				if (k.type == AnnotationType::ANNOTATION_FUNCTION) {
					if (f.stop < k.startOfRange || f.stop > k.endOfRange) {
						continue;
					}
					else {
						collision = true;
						break;
					}
				}
			}
			if (collision) {
				printf("Collision!\n");
			}
			else {
				// TODO: Validate that there is no function annotation inside a range
				if (f.stop - f.start > longest_length) {
					longest = num_found;
					longest_length = f.stop - f.start + 1;
					longest_range = fi;
				}
				num_found++;
				fprintf(output, "function %06X %06X Auto%04d\n", f.start, f.stop, unknownCounter++);
			}
		}
	}

	printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n", num_found, longest, longest_length, longest_range);

	fclose(output);
}